

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O3

bool __thiscall psy::C::Parser::parseArrayDesignator_AtFirst(Parser *this,DesignatorSyntax **desig)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  ArrayDesignatorSyntax *pAVar3;
  IndexType IVar4;
  ostream *poVar5;
  
  pSVar2 = peek(this,1);
  if (pSVar2->syntaxK_ == OpenBracketToken) {
    pAVar3 = makeNode<psy::C::ArrayDesignatorSyntax>(this);
    *desig = &pAVar3->super_DesignatorSyntax;
    IVar4 = consume(this);
    pAVar3->openBracketTkIdx_ = IVar4;
    bVar1 = parseExpressionWithPrecedenceConditional(this,&pAVar3->expr_);
    if (bVar1) {
      bVar1 = matchOrSkipTo(this,CloseBracketToken,&pAVar3->closeBracketTkIdx_);
      return bVar1;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
               ,100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x9fd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"assert failure: `[\'",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  return false;
}

Assistant:

bool Parser::parseArrayDesignator_AtFirst(DesignatorSyntax*& desig)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::OpenBracketToken,
                  return false,
                  "assert failure: `['");

    auto arrDesig = makeNode<ArrayDesignatorSyntax>();
    desig = arrDesig;
    arrDesig->openBracketTkIdx_ = consume();

    return parseExpressionWithPrecedenceConditional(arrDesig->expr_)
                && matchOrSkipTo(SyntaxKind::CloseBracketToken, &arrDesig->closeBracketTkIdx_);
}